

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

void __thiscall CExtKey::SetSeed(CExtKey *this,Span<const_std::byte> seed)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> vout;
  CHMAC_SHA512 local_1b0;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector
            (&vout,0x40,(allocator_type *)&local_1b0);
  CHMAC_SHA512::CHMAC_SHA512(&local_1b0,"Bitcoin seed",0xc);
  CSHA512::Write(&local_1b0.inner,seed.m_data,seed.m_size);
  CHMAC_SHA512::Finalize
            (&local_1b0,
             vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  CKey::Set<unsigned_char*>
            (&this->key,
             vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x20,true);
  uVar1 = *(undefined8 *)
           (vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x20);
  uVar2 = *(undefined8 *)
           (vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x28);
  uVar3 = *(undefined8 *)
           (vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x38);
  *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)
        (vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x30);
  *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar3;
  *(undefined8 *)(this->chaincode).super_base_blob<256U>.m_data._M_elems = uVar1;
  *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 8) = uVar2;
  this->nDepth = '\0';
  this->nChild = 0;
  this->vchFingerprint[0] = '\0';
  this->vchFingerprint[1] = '\0';
  this->vchFingerprint[2] = '\0';
  this->vchFingerprint[3] = '\0';
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
            (&vout.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CExtKey::SetSeed(Span<const std::byte> seed)
{
    static const unsigned char hashkey[] = {'B','i','t','c','o','i','n',' ','s','e','e','d'};
    std::vector<unsigned char, secure_allocator<unsigned char>> vout(64);
    CHMAC_SHA512{hashkey, sizeof(hashkey)}.Write(UCharCast(seed.data()), seed.size()).Finalize(vout.data());
    key.Set(vout.data(), vout.data() + 32, true);
    memcpy(chaincode.begin(), vout.data() + 32, 32);
    nDepth = 0;
    nChild = 0;
    memset(vchFingerprint, 0, sizeof(vchFingerprint));
}